

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void gen_unary_op(c2m_ctx_t c2m_ctx,node_t_conflict r,op_t *op,op_t *res)

{
  MIR_type_t t;
  op_t local_b8;
  op_t local_78;
  
  if ((*r->attr & 1) != 0) {
    __assert_fail("!((struct expr *) r->attr)->const_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2a2c,"void gen_unary_op(c2m_ctx_t, node_t, op_t *, op_t *)");
  }
  gen(&local_b8,c2m_ctx,(r->u).ops.head,(MIR_label_t)0x0,(MIR_label_t)0x0,1,(op_t *)0x0,(int *)0x0);
  op->decl = local_b8.decl;
  *(undefined8 *)&op->field_0x8 = local_b8._8_8_;
  (op->mir_op).data = local_b8.mir_op.data;
  *(undefined8 *)&(op->mir_op).field_0x8 = local_b8.mir_op._8_8_;
  (op->mir_op).u.i = local_b8.mir_op.u.i;
  (op->mir_op).u.str.s = local_b8.mir_op.u.str.s;
  *(undefined8 *)((long)&(op->mir_op).u + 0x10) = local_b8.mir_op.u._16_8_;
  (op->mir_op).u.mem.disp = local_b8.mir_op.u.mem.disp;
  t = get_mir_type(c2m_ctx,*(type **)((long)r->attr + 0x18));
  local_b8.decl = op->decl;
  local_b8._8_8_ = *(undefined8 *)&op->field_0x8;
  local_b8.mir_op.data = (op->mir_op).data;
  local_b8.mir_op._8_8_ = *(undefined8 *)&(op->mir_op).field_0x8;
  local_b8.mir_op.u.i = (op->mir_op).u.i;
  local_b8.mir_op.u.str.s = (op->mir_op).u.str.s;
  local_b8.mir_op.u._16_8_ = *(undefined8 *)((long)&(op->mir_op).u + 0x10);
  local_b8.mir_op.u.mem.disp = (op->mir_op).u.mem.disp;
  if (t - MIR_T_I32 < 7) {
    cast(&local_78,c2m_ctx,*op,t,0);
    op->decl = local_78.decl;
    *(undefined8 *)&op->field_0x8 = local_78._8_8_;
    (op->mir_op).data = local_78.mir_op.data;
    *(undefined8 *)&(op->mir_op).field_0x8 = local_78.mir_op._8_8_;
    (op->mir_op).u.i = local_78.mir_op.u.i;
    (op->mir_op).u.str.s = local_78.mir_op.u.str.s;
    *(undefined8 *)((long)&(op->mir_op).u + 0x10) = local_78.mir_op.u._16_8_;
    (op->mir_op).u.mem.disp = local_78.mir_op.u.mem.disp;
    get_new_temp(&local_b8,c2m_ctx,t);
    res->decl = local_b8.decl;
    *(undefined8 *)&res->field_0x8 = local_b8._8_8_;
    (res->mir_op).data = local_b8.mir_op.data;
    *(undefined8 *)&(res->mir_op).field_0x8 = local_b8.mir_op._8_8_;
    (res->mir_op).u.i = local_b8.mir_op.u.i;
    (res->mir_op).u.str.s = local_b8.mir_op.u.str.s;
    *(undefined8 *)((long)&(res->mir_op).u + 0x10) = local_b8.mir_op.u._16_8_;
    (res->mir_op).u.mem.disp = local_b8.mir_op.u.mem.disp;
    return;
  }
  __assert_fail("t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_F || t == MIR_T_D || t == MIR_T_LD"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x29d8,"op_t promote(c2m_ctx_t, op_t, MIR_type_t, int)");
}

Assistant:

static void gen_unary_op (c2m_ctx_t c2m_ctx, node_t r, op_t *op, op_t *res) {
  MIR_type_t t;

  assert (!((struct expr *) r->attr)->const_p);
  *op = val_gen (c2m_ctx, NL_HEAD (r->u.ops));
  t = get_mir_type (c2m_ctx, ((struct expr *) r->attr)->type);
  *op = promote (c2m_ctx, *op, t, FALSE);
  *res = get_new_temp (c2m_ctx, t);
}